

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

int mcpl_tool_usage(char **argv,char *errmsg)

{
  char *__ptr;
  
  if (errmsg == (char *)0x0) {
    __ptr = mcpl_usage_progname(*argv);
    puts("Tool for inspecting or modifying Monte Carlo Particle List (.mcpl) files.");
    putchar(10);
    puts("The default behaviour is to display the contents of the FILE in human readable");
    puts("format (see Dump Options below for how to modify what is displayed).");
    putchar(10);
    puts("This installation supports direct reading of gzipped files (.mcpl.gz).");
    putchar(10);
    puts("Usage:");
    printf("  %s [dump-options] FILE\n",__ptr);
    printf("  %s --merge [merge-options] FILE1 FILE2\n",__ptr);
    printf("  %s --extract [extract-options] FILE1 FILE2\n",__ptr);
    printf("  %s --repair FILE\n",__ptr);
    printf("  %s --version\n",__ptr);
    printf("  %s --help\n",__ptr);
    putchar(10);
    puts("Dump options:");
    puts("  By default include the info in the FILE header plus the first ten contained");
    puts("  particles. Modify with the following options:");
    puts("  -j, --justhead  : Dump just header info and no particle info.");
    puts("  -n, --nohead    : Dump just particle info and no header info.");
    printf("  -lN             : Dump up to N particles from the file (default %i). You\n",10);
    puts("                    can specify -l0 to disable this limit.");
    printf("  -sN             : Skip past the first N particles in the file (default %i).\n",0);
    puts("  -bKEY           : Dump binary blob stored under KEY to standard output.");
    putchar(10);
    puts("Merge options:");
    puts("  -m, --merge FILEOUT FILE1 FILE2 ... FILEN");
    puts("                    Creates new FILEOUT with combined particle contents from");
    puts("                    specified list of N existing and compatible files.");
    puts("  -m, --merge --inplace FILE1 FILE2 ... FILEN");
    puts("                    Appends the particle contents in FILE2 ... FILEN into");
    puts("                    FILE1. Note that this action modifies FILE1!");
    puts("  --forcemerge [--keepuserflags] FILEOUT FILE1 FILE2 ... FILEN");
    puts("               Like --merge but works with incompatible files as well, at the");
    puts("               heavy price of discarding most metadata like comments and blobs.");
    puts("               Userflags will be discarded unless --keepuserflags is specified.");
    putchar(10);
    puts("Extract options:");
    puts("  -e, --extract FILE1 FILE2");
    puts("                    Extracts particles from FILE1 into a new FILE2.");
    puts("  -lN, -sN        : Select range of particles in FILE1 (as above).");
    puts("  -pPDGCODE       : Select particles of type given by PDGCODE.");
    putchar(10);
    puts("Other options:");
    puts("  -r, --repair FILE");
    puts("                    Attempt to repair FILE which was not properly closed, by up-");
    puts("                    dating the file header with the correct number of particles.");
    puts("  -t, --text MCPLFILE OUTFILE");
    puts("                    Read particle contents of MCPLFILE and write into OUTFILE");
    puts("                    using a simple ASCII-based format.");
    puts("  -v, --version   : Display version of MCPL installation.");
    puts("  -h, --help      : Display this usage information (ignores all other options).");
    free(__ptr);
  }
  else {
    printf("ERROR: %s\n\n");
    puts("Run with -h or --help for usage information");
  }
  return (uint)(errmsg != (char *)0x0);
}

Assistant:

MCPL_LOCAL int mcpl_tool_usage( char** argv, const char * errmsg ) {
  if (errmsg) {
    printf("ERROR: %s\n\n",errmsg);
    printf("Run with -h or --help for usage information\n");
    return 1;
  }
  char * progname = mcpl_usage_progname(argv[0]);
  printf("Tool for inspecting or modifying Monte Carlo Particle List (.mcpl) files.\n");
  printf("\n");
  printf("The default behaviour is to display the contents of the FILE in human readable\n");
  printf("format (see Dump Options below for how to modify what is displayed).\n");
  printf("\n");
  printf("This installation supports direct reading of gzipped files (.mcpl.gz).\n");
  printf("\n");
  printf("Usage:\n");
  printf("  %s [dump-options] FILE\n",progname);
  printf("  %s --merge [merge-options] FILE1 FILE2\n",progname);
  printf("  %s --extract [extract-options] FILE1 FILE2\n",progname);
  printf("  %s --repair FILE\n",progname);
  printf("  %s --version\n",progname);
  printf("  %s --help\n",progname);
  printf("\n");
  printf("Dump options:\n");
  printf("  By default include the info in the FILE header plus the first ten contained\n");
  printf("  particles. Modify with the following options:\n");
  MCPL_STATIC_ASSERT(MCPLIMP_TOOL_DEFAULT_NLIMIT==10);
  printf("  -j, --justhead  : Dump just header info and no particle info.\n");
  printf("  -n, --nohead    : Dump just particle info and no header info.\n");
  printf("  -lN             : Dump up to N particles from the file (default %i). You\n",MCPLIMP_TOOL_DEFAULT_NLIMIT);
  printf("                    can specify -l0 to disable this limit.\n");
  printf("  -sN             : Skip past the first N particles in the file (default %i).\n",MCPLIMP_TOOL_DEFAULT_NSKIP);
  printf("  -bKEY           : Dump binary blob stored under KEY to standard output.\n");
  printf("\n");
  printf("Merge options:\n");
  printf("  -m, --merge FILEOUT FILE1 FILE2 ... FILEN\n");
  printf("                    Creates new FILEOUT with combined particle contents from\n");
  printf("                    specified list of N existing and compatible files.\n");
  printf("  -m, --merge --inplace FILE1 FILE2 ... FILEN\n");
  printf("                    Appends the particle contents in FILE2 ... FILEN into\n");
  printf("                    FILE1. Note that this action modifies FILE1!\n");
  printf("  --forcemerge [--keepuserflags] FILEOUT FILE1 FILE2 ... FILEN\n");
  printf("               Like --merge but works with incompatible files as well, at the\n");
  printf("               heavy price of discarding most metadata like comments and blobs.\n");
  printf("               Userflags will be discarded unless --keepuserflags is specified.\n");
  printf("\n");
  printf("Extract options:\n");
  printf("  -e, --extract FILE1 FILE2\n");
  printf("                    Extracts particles from FILE1 into a new FILE2.\n");
  printf("  -lN, -sN        : Select range of particles in FILE1 (as above).\n");
  printf("  -pPDGCODE       : Select particles of type given by PDGCODE.\n");
  printf("\n");
  printf("Other options:\n");
  printf("  -r, --repair FILE\n");
  printf("                    Attempt to repair FILE which was not properly closed, by up-\n");
  printf("                    dating the file header with the correct number of particles.\n");
  printf("  -t, --text MCPLFILE OUTFILE\n");
  printf("                    Read particle contents of MCPLFILE and write into OUTFILE\n");
  printf("                    using a simple ASCII-based format.\n");
  printf("  -v, --version   : Display version of MCPL installation.\n");
  printf("  -h, --help      : Display this usage information (ignores all other options).\n");

  free(progname);
  return 0;
}